

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void update_tx_type_count
               (AV1_COMP *cpi,AV1_COMMON *cm,MACROBLOCKD *xd,int blk_row,int blk_col,int plane,
               TX_SIZE tx_size,FRAME_COUNTS *counts,uint8_t allow_update_cdf)

{
  byte bVar1;
  byte bVar2;
  int blk_col_00;
  uint use_reduced_set;
  int iVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  byte in_stack_00000008;
  PREDICTION_MODE intra_dir;
  TxSetType tx_set_type;
  int eset;
  TX_TYPE default_type;
  TX_TYPE tx_type;
  FRAME_CONTEXT *fc;
  int reduced_tx_set_used;
  int is_inter;
  MB_MODE_INFO *mbmi;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb6;
  byte bVar4;
  TX_SIZE in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbe;
  long lVar5;
  long lVar6;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar6 = **(long **)(in_RDX + 0x1eb8);
  blk_col_00 = is_inter_block((MB_MODE_INFO *)
                              CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,
                                                CONCAT24(in_stack_ffffffffffffffb4,
                                                         in_stack_ffffffffffffffb0))));
  use_reduced_set = (uint)(*(byte *)(in_RSI + 0x1f5) & 1);
  lVar5 = *(long *)(in_RDX + 0x2998);
  if (in_R9D < 1) {
    bVar1 = av1_get_tx_type((MACROBLOCKD *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                            (PLANE_TYPE)((ulong)lVar6 >> 0x38),(int)lVar6,blk_col_00,'\0',
                            (int)((ulong)lVar5 >> 0x20));
    if (((blk_col_00 == 0) && ((*(byte *)(in_RDI + 0x426f4) & 1) == 0)) &&
       ((*(byte *)(in_RDI + 0x426f6) & 1) != 0)) {
      get_default_tx_type((PLANE_TYPE)((ulong)lVar5 >> 0x30),
                          (MACROBLOCKD *)
                          CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffbe,
                                                  CONCAT24(in_stack_ffffffffffffffbc,
                                                           in_stack_ffffffffffffffb8))),
                          in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0);
    }
    iVar3 = get_ext_tx_types(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffac);
    if (((1 < iVar3) && (0 < *(int *)(in_RSI + 0x268))) &&
       ((*(char *)(lVar6 + 0x90) == '\0' &&
        ((iVar3 = segfeature_active((segmentation *)(in_RSI + 19000),
                                    (byte)*(undefined2 *)(lVar6 + 0xa7) & 7,'\x06'), iVar3 == 0 &&
         (iVar3 = get_ext_tx_set(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0,
                                 in_stack_ffffffffffffffac), 0 < iVar3)))))) {
      bVar2 = av1_get_ext_tx_set_type(in_stack_00000008,blk_col_00,use_reduced_set);
      if (blk_col_00 == 0) {
        if (*(char *)(lVar6 + 0x5b) == '\0') {
          bVar4 = *(byte *)(lVar6 + 2);
        }
        else {
          bVar4 = ""[*(byte *)(lVar6 + 0x5a)];
        }
        if ((char)fc != '\0') {
          update_cdf((aom_cdf_prob *)
                     (lVar5 + 0x3b42 + (long)iVar3 * 0x6e8 + (ulong)""[in_stack_00000008] * 0x1ba +
                     (ulong)bVar4 * 0x22),(int8_t)av1_ext_tx_ind[bVar2][bVar1],
                     av1_num_ext_tx_set[bVar2]);
        }
      }
      else if ((char)fc != '\0') {
        update_cdf((aom_cdf_prob *)
                   (lVar5 + 0x4ffa + (long)iVar3 * 0x88 + (ulong)""[in_stack_00000008] * 0x22),
                   (int8_t)av1_ext_tx_ind[bVar2][bVar1],av1_num_ext_tx_set[bVar2]);
      }
    }
  }
  return;
}

Assistant:

static void update_tx_type_count(const AV1_COMP *cpi, const AV1_COMMON *cm,
                                 MACROBLOCKD *xd, int blk_row, int blk_col,
                                 int plane, TX_SIZE tx_size,
                                 FRAME_COUNTS *counts,
                                 uint8_t allow_update_cdf) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  int is_inter = is_inter_block(mbmi);
  const int reduced_tx_set_used = cm->features.reduced_tx_set_used;
  FRAME_CONTEXT *fc = xd->tile_ctx;
#if !CONFIG_ENTROPY_STATS
  (void)counts;
#endif  // !CONFIG_ENTROPY_STATS

  // Only y plane's tx_type is updated
  if (plane > 0) return;
  const TX_TYPE tx_type = av1_get_tx_type(xd, PLANE_TYPE_Y, blk_row, blk_col,
                                          tx_size, reduced_tx_set_used);
  if (is_inter) {
    if (cpi->oxcf.txfm_cfg.use_inter_dct_only) {
      assert(tx_type == DCT_DCT);
    }
  } else {
    if (cpi->oxcf.txfm_cfg.use_intra_dct_only) {
      assert(tx_type == DCT_DCT);
    } else if (cpi->oxcf.txfm_cfg.use_intra_default_tx_only) {
      const TX_TYPE default_type = get_default_tx_type(
          PLANE_TYPE_Y, xd, tx_size, cpi->use_screen_content_tools);
      (void)default_type;
      // TODO(kyslov): We don't always respect use_intra_default_tx_only flag in
      // NonRD and REALTIME case. Specifically we ignore it in hybrid inta mode
      // search, when picking up intra mode in nonRD inter mode search and in RD
      // REALTIME mode when we limit TX type usage.
      // We need to fix txfm cfg for these cases. Meanwhile relieving the
      // assert.
      assert(tx_type == default_type || cpi->sf.rt_sf.use_nonrd_pick_mode ||
             cpi->oxcf.mode == REALTIME);
    }
  }

  if (get_ext_tx_types(tx_size, is_inter, reduced_tx_set_used) > 1 &&
      cm->quant_params.base_qindex > 0 && !mbmi->skip_txfm &&
      !segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP)) {
    const int eset = get_ext_tx_set(tx_size, is_inter, reduced_tx_set_used);
    if (eset > 0) {
      const TxSetType tx_set_type =
          av1_get_ext_tx_set_type(tx_size, is_inter, reduced_tx_set_used);
      if (is_inter) {
        if (allow_update_cdf) {
          update_cdf(fc->inter_ext_tx_cdf[eset][txsize_sqr_map[tx_size]],
                     av1_ext_tx_ind[tx_set_type][tx_type],
                     av1_num_ext_tx_set[tx_set_type]);
        }
#if CONFIG_ENTROPY_STATS
        ++counts->inter_ext_tx[eset][txsize_sqr_map[tx_size]]
                              [av1_ext_tx_ind[tx_set_type][tx_type]];
#endif  // CONFIG_ENTROPY_STATS
      } else {
        PREDICTION_MODE intra_dir;
        if (mbmi->filter_intra_mode_info.use_filter_intra)
          intra_dir = fimode_to_intradir[mbmi->filter_intra_mode_info
                                             .filter_intra_mode];
        else
          intra_dir = mbmi->mode;
#if CONFIG_ENTROPY_STATS
        ++counts->intra_ext_tx[eset][txsize_sqr_map[tx_size]][intra_dir]
                              [av1_ext_tx_ind[tx_set_type][tx_type]];
#endif  // CONFIG_ENTROPY_STATS
        if (allow_update_cdf) {
          update_cdf(
              fc->intra_ext_tx_cdf[eset][txsize_sqr_map[tx_size]][intra_dir],
              av1_ext_tx_ind[tx_set_type][tx_type],
              av1_num_ext_tx_set[tx_set_type]);
        }
      }
    }
  }
}